

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::format_uint<4u,char,fmt::v8::appender,unsigned_int>
                   (appender out,uint value,int num_digits,bool upper)

{
  type tVar1;
  char *buffer_00;
  char local_41 [8];
  char buffer [9];
  char *ptr;
  bool upper_local;
  int num_digits_local;
  uint value_local;
  appender out_local;
  
  buffer._1_8_ = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  tVar1 = to_unsigned<int>(num_digits);
  buffer_00 = to_pointer<char>((buffer_appender<char>)buffer._1_8_,(ulong)tVar1);
  if (buffer_00 == (char *)0x0) {
    format_uint<4u,char,unsigned_int>(local_41,value,num_digits,upper);
    out_local = copy_str_noinline<char,char*,fmt::v8::appender>(local_41,local_41 + num_digits,out);
  }
  else {
    format_uint<4u,char,unsigned_int>(buffer_00,value,num_digits,upper);
    out_local.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
         out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  }
  return (appender)
         out_local.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

inline auto format_uint(It out, UInt value, int num_digits, bool upper = false)
    -> It {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str_noinline<Char>(buffer, buffer + num_digits, out);
}